

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshifter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_188b5f::PshifterState::process
          (PshifterState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  array<double,_1024UL> *__dest;
  array<std::complex<double>,_1024UL> *paVar1;
  array<(anonymous_namespace)::FrequencyBin,_513UL> *__s;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  int iVar8;
  uint uVar9;
  unsigned_long __n2;
  ulong *puVar10;
  ulong uVar11;
  size_t k;
  float *pfVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  double dVar19;
  span<std::complex<double>,_18446744073709551615UL> buffer;
  span<std::complex<double>,_18446744073709551615UL> buffer_00;
  span<const_float,_18446744073709551615UL> sVar20;
  double local_40;
  double local_38;
  
  if (samplesToDo != 0) {
    __dest = &this->mFIFO;
    paVar1 = &this->mFftBuffer;
    __s = &this->mSynthesisBuffer;
    pdVar2 = &(this->mAnalysisBuffer)._M_elems[0].FreqBin;
    uVar17 = 0;
    do {
      sVar18 = this->mCount;
      uVar11 = samplesToDo - uVar17;
      if (0x400 - sVar18 < samplesToDo - uVar17) {
        uVar11 = 0x400 - sVar18;
      }
      if (uVar11 != 0) {
        pfVar12 = (this->mBufferOut)._M_elems + uVar17;
        lVar15 = 0;
        do {
          *pfVar12 = (float)*(double *)((long)__dest->_M_elems + lVar15 + sVar18 * 8);
          pfVar12 = pfVar12 + 1;
          lVar15 = lVar15 + 8;
        } while (uVar11 * 8 - lVar15 != 0);
        if (0 < (long)uVar11) {
          uVar14 = uVar11 + 1;
          lVar15 = 0;
          do {
            *(double *)((long)__dest->_M_elems + lVar15 * 2 + sVar18 * 8) =
                 (double)*(float *)((long)(samplesIn.mData)->_M_elems + lVar15 + uVar17 * 4);
            uVar14 = uVar14 - 1;
            lVar15 = lVar15 + 4;
          } while (1 < uVar14);
        }
      }
      this->mCount = sVar18 + uVar11;
      if (sVar18 + uVar11 < 0x400) break;
      uVar17 = uVar17 + uVar11;
      this->mCount = 0x300;
      lVar15 = 0;
      do {
        pdVar3 = (double *)((long)(this->mFIFO)._M_elems + lVar15);
        dVar4 = *pdVar3;
        dVar7 = *(double *)((long)&(anonymous_namespace)::HannWindow + lVar15);
        pdVar13 = (double *)((this->mFftBuffer)._M_elems[1]._M_value + lVar15 * 2);
        *pdVar13 = pdVar3[1] * *(double *)(lVar15 + 0x22ae68);
        pdVar13[1] = 0.0;
        pdVar13 = (double *)(paVar1->_M_elems[0]._M_value + lVar15 * 2);
        *pdVar13 = dVar4 * dVar7;
        pdVar13[1] = 0.0;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x2000);
      buffer.mDataEnd = (pointer)&this->mAnalysisBuffer;
      buffer.mData = paVar1->_M_elems;
      complex_fft(buffer,-1.0);
      lVar15 = 0;
      pdVar13 = pdVar2;
      do {
        dVar4 = pdVar13[-0x801];
        dVar7 = cabs(dVar4);
        dVar4 = carg(dVar4);
        dVar19 = (dVar4 - (this->mLastPhase)._M_elems[lVar15]) - (double)lVar15 * 1.5707963267948966
        ;
        iVar8 = (int)(dVar19 / 3.141592653589793);
        ((FrequencyBin *)(pdVar13 + -1))->Amplitude = dVar7;
        *pdVar13 = ((double)(iVar8 % 2 + iVar8) * -3.141592653589793 + dVar19) / 1.5707963267948966
                   + (double)lVar15;
        (this->mLastPhase)._M_elems[lVar15] = dVar4;
        lVar15 = lVar15 + 1;
        pdVar13 = pdVar13 + 2;
      } while (lVar15 != 0x201);
      memset(__s,0,0x2010);
      uVar5 = this->mPitchShiftI;
      uVar9 = (uint)(0x2007ff / (ulong)uVar5);
      if (0x1ff < uVar9) {
        uVar9 = 0x200;
      }
      dVar4 = this->mPitchShift;
      uVar11 = 0x800;
      uVar14 = 0;
      pdVar13 = pdVar2;
      do {
        uVar16 = uVar11 >> 8 & 0xfffffffffffffff0;
        *(double *)((long)&__s->_M_elems[0].Amplitude + uVar16) =
             ((FrequencyBin *)(pdVar13 + -1))->Amplitude +
             *(double *)((long)&__s->_M_elems[0].Amplitude + uVar16);
        *(double *)((long)&(this->mSynthesisBuffer)._M_elems[0].FreqBin + uVar16) = *pdVar13 * dVar4
        ;
        uVar14 = uVar14 + 1;
        uVar11 = uVar11 + uVar5;
        pdVar13 = pdVar13 + 2;
      } while (uVar14 < uVar9 + 1);
      lVar15 = 0x3024;
      do {
        dVar4 = *(double *)((long)((this->mFftBuffer)._M_elems + -3) + lVar15 * 2) *
                1.5707963267948966 + *(double *)((long)(this->mFIFO)._M_elems + lVar15 + -0x1c);
        *(double *)((long)(this->mFIFO)._M_elems + lVar15 + -0x1c) = dVar4;
        sincos(dVar4,&local_38,&local_40);
        dVar4 = *(double *)((this->mFftBuffer)._M_elems[0]._M_value + lVar15 * 2 + -0x38);
        pdVar13 = (double *)((long)(this->mFIFO)._M_elems + lVar15 * 2 + -0x38);
        *pdVar13 = local_40 * dVar4;
        pdVar13[1] = local_38 * dVar4;
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x402c);
      lVar15 = 0;
      puVar10 = (ulong *)((this->mFftBuffer)._M_elems[0x1ff]._M_value + 8);
      do {
        uVar11 = *puVar10;
        *(ulong *)((this->mFftBuffer)._M_elems[0x201]._M_value + lVar15) = puVar10[-1];
        *(ulong *)((this->mFftBuffer)._M_elems[0x201]._M_value + lVar15 + 8) =
             uVar11 ^ 0x8000000000000000;
        lVar15 = lVar15 + 0x10;
        puVar10 = puVar10 + -2;
      } while (lVar15 != 0x1ff0);
      buffer_00.mDataEnd = (pointer)&this->mAnalysisBuffer;
      buffer_00.mData = paVar1->_M_elems;
      complex_fft(buffer_00,1.0);
      lVar15 = 0;
      do {
        pdVar13 = (double *)((long)(this->mOutputAccum)._M_elems + lVar15);
        dVar4 = *(double *)((this->mFftBuffer)._M_elems[1]._M_value + lVar15 * 2) *
                *(double *)(lVar15 + 0x22ae68) * 0.0009765625 + pdVar13[1];
        auVar6._8_4_ = SUB84(dVar4,0);
        auVar6._0_8_ = *(double *)((this->mFftBuffer)._M_elems[0]._M_value + lVar15 * 2) *
                       *(double *)((long)&(anonymous_namespace)::HannWindow + lVar15) * 0.0009765625
                       + *pdVar13;
        auVar6._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])((long)(this->mOutputAccum)._M_elems + lVar15) = auVar6;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x2000);
      memmove(__dest,(this->mFIFO)._M_elems + 0x100,0x1800);
      memcpy((this->mFIFO)._M_elems + 0x300,&this->mOutputAccum,0x800);
      memmove(&this->mOutputAccum,(this->mOutputAccum)._M_elems + 0x100,0x1800);
      memset((this->mOutputAccum)._M_elems + 0x300,0,0x800);
    } while (uVar17 < samplesToDo);
  }
  sVar20.mDataEnd = (this->mBufferOut)._M_elems + samplesToDo;
  sVar18 = 0x200;
  if (0x200 < samplesToDo) {
    sVar18 = samplesToDo;
  }
  sVar20.mData = (this->mBufferOut)._M_elems;
  (*MixSamples)(sVar20,samplesOut,this->mCurrentGains,this->mTargetGains,sVar18,0);
  return;
}

Assistant:

void PshifterState::process(const size_t samplesToDo, const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    /* Pitch shifter engine based on the work of Stephan Bernsee.
     * http://blogs.zynaptiq.com/bernsee/pitch-shifting-using-the-ft/
     */

    /* Cycle offset per update expected of each frequency bin (bin 0 is none,
     * bin 1 is x1, bin 2 is x2, etc).
     */
    constexpr double expected_cycles{al::MathDefs<double>::Tau() / OVERSAMP};

    for(size_t base{0u};base < samplesToDo;)
    {
        const size_t todo{minz(STFT_SIZE-mCount, samplesToDo-base)};

        /* Retrieve the output samples from the FIFO and fill in the new input
         * samples.
         */
        auto fifo_iter = mFIFO.begin() + mCount;
        std::transform(fifo_iter, fifo_iter+todo, mBufferOut.begin()+base,
            [](double d) noexcept -> float { return static_cast<float>(d); });

        std::copy_n(samplesIn[0].begin()+base, todo, fifo_iter);
        mCount += todo;
        base += todo;

        /* Check whether FIFO buffer is filled with new samples. */
        if(mCount < STFT_SIZE) break;
        mCount = FIFO_LATENCY;

        /* Time-domain signal windowing, store in FftBuffer, and apply a
         * forward FFT to get the frequency-domain signal.
         */
        for(size_t k{0u};k < STFT_SIZE;k++)
            mFftBuffer[k] = mFIFO[k] * HannWindow[k];
        forward_fft(mFftBuffer);

        /* Analyze the obtained data. Since the real FFT is symmetric, only
         * STFT_HALF_SIZE+1 samples are needed.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            const double amplitude{std::abs(mFftBuffer[k])};
            const double phase{std::arg(mFftBuffer[k])};

            /* Compute phase difference and subtract expected phase difference */
            double tmp{(phase - mLastPhase[k]) - static_cast<double>(k)*expected_cycles};

            /* Map delta phase into +/- Pi interval */
            int qpd{double2int(tmp / al::MathDefs<double>::Pi())};
            tmp -= al::MathDefs<double>::Pi() * (qpd + (qpd%2));

            /* Get deviation from bin frequency from the +/- Pi interval */
            tmp /= expected_cycles;

            /* Compute the k-th partials' true frequency and store the
             * amplitude and frequency bin in the analysis buffer.
             */
            mAnalysisBuffer[k].Amplitude = amplitude;
            mAnalysisBuffer[k].FreqBin = static_cast<double>(k) + tmp;

            /* Store the actual phase[k] for the next frame. */
            mLastPhase[k] = phase;
        }

        /* Shift the frequency bins according to the pitch adjustment,
         * accumulating the amplitudes of overlapping frequency bins.
         */
        std::fill(mSynthesisBuffer.begin(), mSynthesisBuffer.end(), FrequencyBin{});
        const size_t bin_count{minz(STFT_HALF_SIZE+1,
            (((STFT_HALF_SIZE+1)<<MixerFracBits) - (MixerFracOne>>1) - 1)/mPitchShiftI + 1)};
        for(size_t k{0u};k < bin_count;k++)
        {
            const size_t j{(k*mPitchShiftI + (MixerFracOne>>1)) >> MixerFracBits};
            mSynthesisBuffer[j].Amplitude += mAnalysisBuffer[k].Amplitude;
            mSynthesisBuffer[j].FreqBin    = mAnalysisBuffer[k].FreqBin * mPitchShift;
        }

        /* Reconstruct the frequency-domain signal from the adjusted frequency
         * bins.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            /* Calculate actual delta phase and accumulate it to get bin phase */
            mSumPhase[k] += mSynthesisBuffer[k].FreqBin * expected_cycles;

            mFftBuffer[k] = std::polar(mSynthesisBuffer[k].Amplitude, mSumPhase[k]);
        }
        for(size_t k{STFT_HALF_SIZE+1};k < STFT_SIZE;++k)
            mFftBuffer[k] = std::conj(mFftBuffer[STFT_SIZE-k]);

        /* Apply an inverse FFT to get the time-domain siganl, and accumulate
         * for the output with windowing.
         */
        inverse_fft(mFftBuffer);
        for(size_t k{0u};k < STFT_SIZE;k++)
            mOutputAccum[k] += HannWindow[k]*mFftBuffer[k].real() * (4.0/OVERSAMP/STFT_SIZE);

        /* Shift FIFO and accumulator. */
        fifo_iter = std::copy(mFIFO.begin()+STFT_STEP, mFIFO.end(), mFIFO.begin());
        std::copy_n(mOutputAccum.begin(), STFT_STEP, fifo_iter);
        auto accum_iter = std::copy(mOutputAccum.begin()+STFT_STEP, mOutputAccum.end(),
            mOutputAccum.begin());
        std::fill(accum_iter, mOutputAccum.end(), 0.0);
    }

    /* Now, mix the processed sound data to the output. */
    MixSamples({mBufferOut.data(), samplesToDo}, samplesOut, mCurrentGains, mTargetGains,
        maxz(samplesToDo, 512), 0);
}